

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_cbor.hpp
# Opt level: O0

type jsoncons::cbor::
     decode_cbor<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      last,cbor_decode_options *options)

{
  error_code ec;
  bool bVar1;
  undefined8 uVar2;
  cbor_decode_options *in_RCX;
  cbor_decode_options *options_00;
  void *__buf;
  undefined8 extraout_RDX;
  int __fd;
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  *in_RDI;
  type tVar3;
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  reader;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  adaptor;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffca8;
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  conv_errc __e;
  error_code *in_stack_fffffffffffffcc0;
  json_visitor *visitor;
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  *this;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *first_00;
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  temp_allocator_type *in_stack_fffffffffffffd00;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffd08;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffd10;
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  local_2b8;
  undefined1 local_a2;
  undefined1 local_a1 [129];
  cbor_decode_options *local_20;
  
  __e = (conv_errc)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
  first_00 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_a1;
  this = in_RDI;
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  this_00 = (binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&local_a2;
  std::allocator<char>::allocator();
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(in_stack_fffffffffffffd10,(allocator_type *)in_stack_fffffffffffffd08,
                 in_stack_fffffffffffffd00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a2);
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  make_json_visitor_adaptor<jsoncons::basic_json_visitor<char>,jsoncons::json_decoder<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>>
            (in_stack_fffffffffffffca8);
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::binary_iterator_source
            (this_00,first_00,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)this,(size_t)in_RDI);
  visitor = (json_visitor *)&stack0xfffffffffffffd0f;
  options_00 = local_20;
  std::allocator<char>::allocator();
  __fd = (int)&stack0xfffffffffffffd10;
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::allocator<char>>
  ::
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            (this,(binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)in_RDI,visitor,options_00,(allocator<char> *)in_stack_fffffffffffffcc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd0f);
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~binary_iterator_source
            ((binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)0x3591e9);
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  ::read(&local_2b8,__fd,__buf,(size_t)options_00);
  bVar1 = json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          ::is_valid((json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                      *)(local_a1 + 1));
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>(in_stack_fffffffffffffcc0,__e);
    basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
    ::line((basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
            *)0x35923c);
    basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
    ::column((basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
              *)0x35924b);
    ec._M_cat = (error_category *)this_00;
    ec._0_8_ = first_00;
    ser_error::ser_error((ser_error *)this,ec,(size_t)in_RDI,(size_t)visitor);
    __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
  }
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result(in_stack_fffffffffffffd08);
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  ::~basic_cbor_reader(in_stack_fffffffffffffcb0);
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  ::~json_visitor_adaptor
            ((json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
              *)0x359381);
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::~json_decoder((json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                   *)in_stack_fffffffffffffcb0);
  tVar3.field_0.int64_.val_ = extraout_RDX;
  tVar3.field_0._0_8_ = this;
  return (type)tVar3.field_0;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,T>::type 
    decode_cbor(InputIt first, InputIt last,
                const cbor_decode_options& options = cbor_decode_options())
    {
        jsoncons::json_decoder<T> decoder;
        auto adaptor = make_json_visitor_adaptor<json_visitor>(decoder);
        basic_cbor_reader<binary_iterator_source<InputIt>> reader(binary_iterator_source<InputIt>(first, last), adaptor, options);
        reader.read();
        if (!decoder.is_valid())
        {
            JSONCONS_THROW(ser_error(conv_errc::conversion_failed, reader.line(), reader.column()));
        }
        return decoder.get_result();
    }